

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# memory_tree.cc
# Opt level: O0

void memory_tree_ns::save_load_example
               (example *ec,io_buf *model_file,bool *read,bool *text,stringstream *msg,int *oas)

{
  byte *pbVar1;
  uint uVar2;
  ostream *poVar3;
  uint *puVar4;
  size_t sVar5;
  char *pcVar6;
  uchar *puVar7;
  uchar **ppuVar8;
  v_array<float> *this;
  float *pfVar9;
  unsigned_long *puVar10;
  byte *in_RCX;
  byte *in_RDX;
  features *in_RSI;
  v_array<unsigned_char> *in_RDI;
  long in_R8;
  int *in_R9;
  uint32_t f_i_2;
  uint32_t f_i_1;
  uint32_t f_i;
  size_t feat_size;
  features *fs;
  namespace_index nc;
  uchar *__end1;
  uchar *__begin1;
  v_array<unsigned_char> *__range1;
  uint32_t i_5;
  uint32_t i_4;
  size_t namespace_size;
  uint32_t i_3;
  uint32_t i_2;
  size_t tag_number;
  uint32_t i_1;
  uint32_t i;
  size_t label_size;
  undefined4 in_stack_fffffffffffffeac;
  features *in_stack_fffffffffffffeb0;
  ostream *in_stack_fffffffffffffeb8;
  features *in_stack_fffffffffffffec0;
  ostream *in_stack_fffffffffffffec8;
  features *in_stack_fffffffffffffed0;
  ostream *in_stack_fffffffffffffed8;
  features *in_stack_fffffffffffffee0;
  io_buf *in_stack_fffffffffffffee8;
  uint local_f4;
  uint local_f0;
  uint local_ec;
  float *local_e8;
  float *local_e0;
  float *local_d8;
  size_t local_d0;
  float *local_c8;
  float *local_c0;
  float *local_b8;
  size_t local_b0;
  byte *local_88;
  uint local_74;
  uint local_6c;
  uint local_5c;
  uint local_54;
  uint local_44;
  uint local_3c;
  
  poVar3 = std::operator<<((ostream *)(in_R8 + 0x10),"num_features");
  poVar3 = std::operator<<(poVar3," = ");
  poVar3 = (ostream *)std::ostream::operator<<(poVar3,(ulong)in_RDI[0x345]._begin);
  std::operator<<(poVar3," ");
  bin_text_read_write_fixed
            (in_stack_fffffffffffffee8,(char *)in_stack_fffffffffffffee0,
             (size_t)in_stack_fffffffffffffed8,(char *)in_stack_fffffffffffffed0,
             SUB81((ulong)in_stack_fffffffffffffec8 >> 0x38,0),
             (stringstream *)in_stack_fffffffffffffec0,
             SUB81((ulong)in_stack_fffffffffffffeb8 >> 0x38,0));
  poVar3 = std::operator<<((ostream *)(in_R8 + 0x10),"total_sum_features");
  poVar3 = std::operator<<(poVar3," = ");
  poVar3 = (ostream *)
           std::ostream::operator<<(poVar3,*(float *)((long)&in_RDI[0x345].end_array + 4));
  std::operator<<(poVar3," ");
  bin_text_read_write_fixed
            (in_stack_fffffffffffffee8,(char *)in_stack_fffffffffffffee0,
             (size_t)in_stack_fffffffffffffed8,(char *)in_stack_fffffffffffffed0,
             SUB81((ulong)in_stack_fffffffffffffec8 >> 0x38,0),
             (stringstream *)in_stack_fffffffffffffec0,
             SUB81((ulong)in_stack_fffffffffffffeb8 >> 0x38,0));
  poVar3 = std::operator<<((ostream *)(in_R8 + 0x10),"example_weight");
  poVar3 = std::operator<<(poVar3," = ");
  poVar3 = (ostream *)std::ostream::operator<<(poVar3,*(float *)&in_RDI[0x343].end_array);
  std::operator<<(poVar3," ");
  bin_text_read_write_fixed
            (in_stack_fffffffffffffee8,(char *)in_stack_fffffffffffffee0,
             (size_t)in_stack_fffffffffffffed8,(char *)in_stack_fffffffffffffed0,
             SUB81((ulong)in_stack_fffffffffffffec8 >> 0x38,0),
             (stringstream *)in_stack_fffffffffffffec0,
             SUB81((ulong)in_stack_fffffffffffffeb8 >> 0x38,0));
  poVar3 = std::operator<<((ostream *)(in_R8 + 0x10),"loss");
  poVar3 = std::operator<<(poVar3," = ");
  poVar3 = (ostream *)std::ostream::operator<<(poVar3,*(float *)&in_RDI[0x345].end_array);
  std::operator<<(poVar3," ");
  bin_text_read_write_fixed
            (in_stack_fffffffffffffee8,(char *)in_stack_fffffffffffffee0,
             (size_t)in_stack_fffffffffffffed8,(char *)in_stack_fffffffffffffed0,
             SUB81((ulong)in_stack_fffffffffffffec8 >> 0x38,0),
             (stringstream *)in_stack_fffffffffffffec0,
             SUB81((ulong)in_stack_fffffffffffffeb8 >> 0x38,0));
  poVar3 = std::operator<<((ostream *)(in_R8 + 0x10),"ft_offset");
  poVar3 = std::operator<<(poVar3," = ");
  poVar3 = (ostream *)std::ostream::operator<<(poVar3,(ulong)in_RDI[0x341]._begin);
  std::operator<<(poVar3," ");
  bin_text_read_write_fixed
            (in_stack_fffffffffffffee8,(char *)in_stack_fffffffffffffee0,
             (size_t)in_stack_fffffffffffffed8,(char *)in_stack_fffffffffffffed0,
             SUB81((ulong)in_stack_fffffffffffffec8 >> 0x38,0),
             (stringstream *)in_stack_fffffffffffffec0,
             SUB81((ulong)in_stack_fffffffffffffeb8 >> 0x38,0));
  if (*in_R9 == 0) {
    poVar3 = std::operator<<((ostream *)(in_R8 + 0x10),"multiclass_label");
    poVar3 = std::operator<<(poVar3," = ");
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,*(uint *)&in_RDI[0x341]._end);
    std::operator<<(poVar3," ");
    bin_text_read_write_fixed
              (in_stack_fffffffffffffee8,(char *)in_stack_fffffffffffffee0,
               (size_t)in_stack_fffffffffffffed8,(char *)in_stack_fffffffffffffed0,
               SUB81((ulong)in_stack_fffffffffffffec8 >> 0x38,0),
               (stringstream *)in_stack_fffffffffffffec0,
               SUB81((ulong)in_stack_fffffffffffffeb8 >> 0x38,0));
    poVar3 = std::operator<<((ostream *)(in_R8 + 0x10),"multiclass_weight");
    poVar3 = std::operator<<(poVar3," = ");
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,*(float *)((long)&in_RDI[0x341]._end + 4));
    std::operator<<(poVar3," ");
    bin_text_read_write_fixed
              (in_stack_fffffffffffffee8,(char *)in_stack_fffffffffffffee0,
               (size_t)in_stack_fffffffffffffed8,(char *)in_stack_fffffffffffffed0,
               SUB81((ulong)in_stack_fffffffffffffec8 >> 0x38,0),
               (stringstream *)in_stack_fffffffffffffec0,
               SUB81((ulong)in_stack_fffffffffffffeb8 >> 0x38,0));
  }
  else {
    sVar5 = v_array<unsigned_int>::size((v_array<unsigned_int> *)&in_RDI[0x341]._end);
    poVar3 = std::operator<<((ostream *)(in_R8 + 0x10),"label_size");
    poVar3 = std::operator<<(poVar3," = ");
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,sVar5);
    std::operator<<(poVar3," ");
    uVar2 = (uint)(*in_RCX & 1);
    bin_text_read_write_fixed
              (in_stack_fffffffffffffee8,(char *)in_stack_fffffffffffffee0,
               (size_t)in_stack_fffffffffffffed8,(char *)in_stack_fffffffffffffed0,
               SUB81((ulong)in_stack_fffffffffffffec8 >> 0x38,0),
               (stringstream *)in_stack_fffffffffffffec0,
               SUB81((ulong)in_stack_fffffffffffffeb8 >> 0x38,0));
    if ((*in_RDX & 1) != 0) {
      v_array<unsigned_int>::clear((v_array<unsigned_int> *)in_stack_fffffffffffffeb0);
      for (local_3c = 0; local_3c < sVar5; local_3c = local_3c + 1) {
        v_array<unsigned_int>::push_back
                  ((v_array<unsigned_int> *)in_stack_fffffffffffffeb0,
                   (uint *)CONCAT44(in_stack_fffffffffffffeac,uVar2));
      }
    }
    for (local_44 = 0; local_44 < sVar5; local_44 = local_44 + 1) {
      poVar3 = std::operator<<((ostream *)(in_R8 + 0x10),"ec_label");
      poVar3 = std::operator<<(poVar3," = ");
      puVar4 = v_array<unsigned_int>::operator[]
                         ((v_array<unsigned_int> *)&in_RDI[0x341]._end,(ulong)local_44);
      poVar3 = (ostream *)std::ostream::operator<<(poVar3,*puVar4);
      std::operator<<(poVar3," ");
      v_array<unsigned_int>::operator[]
                ((v_array<unsigned_int> *)&in_RDI[0x341]._end,(ulong)local_44);
      bin_text_read_write_fixed
                (in_stack_fffffffffffffee8,(char *)in_stack_fffffffffffffee0,
                 (size_t)in_stack_fffffffffffffed8,(char *)in_stack_fffffffffffffed0,
                 SUB81((ulong)in_stack_fffffffffffffec8 >> 0x38,0),
                 (stringstream *)in_stack_fffffffffffffec0,
                 SUB81((ulong)in_stack_fffffffffffffeb8 >> 0x38,0));
    }
  }
  sVar5 = v_array<char>::size((v_array<char> *)&in_RDI[0x343].erase_count);
  poVar3 = std::operator<<((ostream *)(in_R8 + 0x10),"tags");
  poVar3 = std::operator<<(poVar3," = ");
  poVar3 = (ostream *)std::ostream::operator<<(poVar3,sVar5);
  std::operator<<(poVar3," ");
  uVar2 = (uint)(*in_RCX & 1);
  bin_text_read_write_fixed
            (in_stack_fffffffffffffee8,(char *)in_stack_fffffffffffffee0,
             (size_t)in_stack_fffffffffffffed8,(char *)in_stack_fffffffffffffed0,
             SUB81((ulong)in_stack_fffffffffffffec8 >> 0x38,0),
             (stringstream *)in_stack_fffffffffffffec0,
             SUB81((ulong)in_stack_fffffffffffffeb8 >> 0x38,0));
  if ((*in_RDX & 1) != 0) {
    v_array<char>::clear((v_array<char> *)in_stack_fffffffffffffeb0);
    for (local_54 = 0; local_54 < sVar5; local_54 = local_54 + 1) {
      v_array<char>::push_back
                ((v_array<char> *)in_stack_fffffffffffffeb0,
                 (char *)CONCAT44(in_stack_fffffffffffffeac,uVar2));
    }
  }
  for (local_5c = 0; local_5c < sVar5; local_5c = local_5c + 1) {
    poVar3 = std::operator<<((ostream *)(in_R8 + 0x10),"tag");
    in_stack_fffffffffffffee8 = (io_buf *)std::operator<<(poVar3," = ");
    pcVar6 = v_array<char>::operator[]((v_array<char> *)&in_RDI[0x343].erase_count,(ulong)local_5c);
    poVar3 = std::operator<<((ostream *)in_stack_fffffffffffffee8,*pcVar6);
    std::operator<<(poVar3," ");
    v_array<char>::operator[]((v_array<char> *)&in_RDI[0x343].erase_count,(ulong)local_5c);
    bin_text_read_write_fixed
              (in_stack_fffffffffffffee8,(char *)in_stack_fffffffffffffee0,
               (size_t)in_stack_fffffffffffffed8,(char *)in_stack_fffffffffffffed0,
               SUB81((ulong)in_stack_fffffffffffffec8 >> 0x38,0),
               (stringstream *)in_stack_fffffffffffffec0,
               SUB81((ulong)in_stack_fffffffffffffeb8 >> 0x38,0));
  }
  sVar5 = v_array<unsigned_char>::size(in_RDI);
  poVar3 = std::operator<<((ostream *)(in_R8 + 0x10),"namespaces");
  poVar3 = std::operator<<(poVar3," = ");
  poVar3 = (ostream *)std::ostream::operator<<(poVar3,sVar5);
  std::operator<<(poVar3," ");
  uVar2 = (uint)(*in_RCX & 1);
  bin_text_read_write_fixed
            (in_stack_fffffffffffffee8,(char *)in_stack_fffffffffffffee0,
             (size_t)in_stack_fffffffffffffed8,(char *)in_stack_fffffffffffffed0,
             SUB81((ulong)in_stack_fffffffffffffec8 >> 0x38,0),
             (stringstream *)in_stack_fffffffffffffec0,
             SUB81((ulong)in_stack_fffffffffffffeb8 >> 0x38,0));
  if ((*in_RDX & 1) != 0) {
    v_array<unsigned_char>::delete_v((v_array<unsigned_char> *)in_stack_fffffffffffffeb0);
    for (local_6c = 0; local_6c < sVar5; local_6c = local_6c + 1) {
      v_array<unsigned_char>::push_back
                ((v_array<unsigned_char> *)in_stack_fffffffffffffeb0,
                 (uchar *)CONCAT44(in_stack_fffffffffffffeac,uVar2));
    }
  }
  for (local_74 = 0; local_74 < sVar5; local_74 = local_74 + 1) {
    poVar3 = std::operator<<((ostream *)(in_R8 + 0x10),"namespace_index");
    in_stack_fffffffffffffed8 = std::operator<<(poVar3," = ");
    puVar7 = v_array<unsigned_char>::operator[](in_RDI,(ulong)local_74);
    poVar3 = std::operator<<(in_stack_fffffffffffffed8,*puVar7);
    std::operator<<(poVar3," ");
    in_stack_fffffffffffffee0 = in_RSI;
    v_array<unsigned_char>::operator[](in_RDI,(ulong)local_74);
    bin_text_read_write_fixed
              (in_stack_fffffffffffffee8,(char *)in_stack_fffffffffffffee0,
               (size_t)in_stack_fffffffffffffed8,(char *)in_stack_fffffffffffffed0,
               SUB81((ulong)in_stack_fffffffffffffec8 >> 0x38,0),
               (stringstream *)in_stack_fffffffffffffec0,
               SUB81((ulong)in_stack_fffffffffffffeb8 >> 0x38,0));
  }
  ppuVar8 = v_array<unsigned_char>::begin(in_RDI);
  local_88 = *ppuVar8;
  ppuVar8 = v_array<unsigned_char>::end(in_RDI);
  pbVar1 = *ppuVar8;
  for (; local_88 != pbVar1; local_88 = local_88 + 1) {
    this = (v_array<float> *)((long)in_RDI + (ulong)*local_88 * 0x68 + 0x20);
    sVar5 = features::size((features *)0x34aac5);
    poVar3 = std::operator<<((ostream *)(in_R8 + 0x10),"features_");
    poVar3 = std::operator<<(poVar3," = ");
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,sVar5);
    std::operator<<(poVar3," ");
    bin_text_read_write_fixed
              (in_stack_fffffffffffffee8,(char *)in_stack_fffffffffffffee0,
               (size_t)in_stack_fffffffffffffed8,(char *)in_stack_fffffffffffffed0,
               SUB81((ulong)in_stack_fffffffffffffec8 >> 0x38,0),
               (stringstream *)in_stack_fffffffffffffec0,
               SUB81((ulong)in_stack_fffffffffffffeb8 >> 0x38,0));
    if ((*in_RDX & 1) != 0) {
      features::clear(in_stack_fffffffffffffeb0);
      v_init<float>();
      this->_begin = local_c8;
      this->_end = local_c0;
      this->end_array = local_b8;
      this->erase_count = local_b0;
      v_init<unsigned_long>();
      this[1]._begin = local_e8;
      this[1]._end = local_e0;
      this[1].end_array = local_d8;
      this[1].erase_count = local_d0;
      for (local_ec = 0; local_ec < sVar5; local_ec = local_ec + 1) {
        features::push_back(in_stack_fffffffffffffec0,
                            (feature_value)((ulong)in_stack_fffffffffffffeb8 >> 0x20),
                            (feature_index)in_stack_fffffffffffffeb0);
      }
    }
    for (local_f0 = 0; local_f0 < sVar5; local_f0 = local_f0 + 1) {
      poVar3 = std::operator<<((ostream *)(in_R8 + 0x10),"value");
      in_stack_fffffffffffffec8 = std::operator<<(poVar3," = ");
      pfVar9 = v_array<float>::operator[](this,(ulong)local_f0);
      poVar3 = (ostream *)std::ostream::operator<<(in_stack_fffffffffffffec8,*pfVar9);
      std::operator<<(poVar3," ");
      in_stack_fffffffffffffed0 = in_RSI;
      v_array<float>::operator[](this,(ulong)local_f0);
      bin_text_read_write_fixed
                (in_stack_fffffffffffffee8,(char *)in_stack_fffffffffffffee0,
                 (size_t)in_stack_fffffffffffffed8,(char *)in_stack_fffffffffffffed0,
                 SUB81((ulong)in_stack_fffffffffffffec8 >> 0x38,0),
                 (stringstream *)in_stack_fffffffffffffec0,
                 SUB81((ulong)in_stack_fffffffffffffeb8 >> 0x38,0));
    }
    for (local_f4 = 0; local_f4 < sVar5; local_f4 = local_f4 + 1) {
      poVar3 = std::operator<<((ostream *)(in_R8 + 0x10),"index");
      in_stack_fffffffffffffeb8 = std::operator<<(poVar3," = ");
      puVar10 = v_array<unsigned_long>::operator[]
                          ((v_array<unsigned_long> *)(this + 1),(ulong)local_f4);
      poVar3 = (ostream *)std::ostream::operator<<(in_stack_fffffffffffffeb8,*puVar10);
      std::operator<<(poVar3," ");
      in_stack_fffffffffffffec0 = in_RSI;
      v_array<unsigned_long>::operator[]((v_array<unsigned_long> *)(this + 1),(ulong)local_f4);
      bin_text_read_write_fixed
                (in_stack_fffffffffffffee8,(char *)in_stack_fffffffffffffee0,
                 (size_t)in_stack_fffffffffffffed8,(char *)in_stack_fffffffffffffed0,
                 SUB81((ulong)in_stack_fffffffffffffec8 >> 0x38,0),
                 (stringstream *)in_stack_fffffffffffffec0,
                 SUB81((ulong)in_stack_fffffffffffffeb8 >> 0x38,0));
    }
  }
  return;
}

Assistant:

void save_load_example(example* ec, io_buf& model_file, bool& read, bool& text, stringstream& msg, int& oas)
    {   //deal with tag
        //deal with labels:
	    writeit(ec->num_features, "num_features");
	    writeit(ec->total_sum_feat_sq, "total_sum_features");
	    writeit(ec->weight, "example_weight");
	    writeit(ec->loss, "loss");
	    writeit(ec->ft_offset, "ft_offset");
        if(oas == false){ //multi-class
            writeit(ec->l.multi.label, "multiclass_label");
            writeit(ec->l.multi.weight, "multiclass_weight");
        }
        else{ //multi-label
            writeitvar(ec->l.multilabels.label_v.size(), "label_size", label_size);
            if (read){
            	ec->l.multilabels.label_v.clear();
            	for (uint32_t i = 0; i < label_size; i++)
                	ec->l.multilabels.label_v.push_back(0);
            }
            for (uint32_t i = 0; i < label_size; i++)
                writeit(ec->l.multilabels.label_v[i], "ec_label");
        }

        writeitvar(ec->tag.size(), "tags", tag_number);
        if (read){
            ec->tag.clear();
            for (uint32_t i = 0; i < tag_number; i++)
                ec->tag.push_back('a');
        }
        for (uint32_t i = 0; i < tag_number; i++)
            writeit(ec->tag[i], "tag");
        
        //deal with tag:
        writeitvar(ec->indices.size(), "namespaces", namespace_size);
        if (read){
            ec->indices.delete_v();
            for (uint32_t i = 0; i< namespace_size; i++){
                ec->indices.push_back('\0');
            }
        }
        for(uint32_t i = 0; i < namespace_size; i++)
            writeit(ec->indices[i], "namespace_index");

        //deal with features
        for (namespace_index nc: ec->indices){
            features* fs = &ec->feature_space[nc];
            writeitvar(fs->size(), "features_", feat_size);
            if (read){
                fs->clear();
                fs->values = v_init<feature_value>();
                fs->indicies = v_init<feature_index>();
                for (uint32_t f_i = 0; f_i < feat_size; f_i++){
                    fs->push_back(0, 0);
                }
            }
            for (uint32_t f_i = 0; f_i < feat_size; f_i++)
                writeit(fs->values[f_i], "value");
            for (uint32_t f_i = 0; f_i < feat_size; f_i++)
                writeit(fs->indicies[f_i], "index");
        }
    }